

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialPivLU.h
# Opt level: O0

void __thiscall
Eigen::internal::
solve_retval<Eigen::PartialPivLU<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>>>
::evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
          (solve_retval<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
           *this,Matrix<double,__1,__1,_0,__1,__1> *dst)

{
  Index IVar1;
  Index IVar2;
  ReturnByValue<Eigen::internal::permut_matrix_product_retval<Eigen::PermutationMatrix<_1,__1,_int>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,_false>_>
  *func;
  PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_RDI;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *in_stack_ffffffffffffffc0;
  PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *in_stack_ffffffffffffffc8;
  
  solve_retval_base<Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::rhs((solve_retval_base<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
         *)in_RDI);
  IVar1 = CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
          ::rows((CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  *)0x2dbdd5);
  solve_retval_base<Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::dec((solve_retval_base<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
         *)in_RDI);
  PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::matrixLU(in_RDI);
  IVar2 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x2dbdf4);
  if (IVar1 == IVar2) {
    solve_retval_base<Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::dec((solve_retval_base<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
           *)in_RDI);
    func = (ReturnByValue<Eigen::internal::permut_matrix_product_retval<Eigen::PermutationMatrix<_1,__1,_int>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,_false>_>
            *)PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::permutationP(in_RDI);
    solve_retval_base<Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::rhs((solve_retval_base<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
           *)in_RDI);
    Eigen::operator*(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    Matrix<double,-1,-1,0,-1,-1>::operator=(&in_RDI->m_lu,func);
    solve_retval_base<Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::dec((solve_retval_base<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
           *)in_RDI);
    PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::matrixLU(in_RDI);
    MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::triangularView<5u>
              ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)func);
    TriangularView<Eigen::Matrix<double,-1,-1,0,-1,-1>const,5u>::
    solveInPlace<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5U> *)in_RDI,
               (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)func);
    solve_retval_base<Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::dec((solve_retval_base<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
           *)in_RDI);
    PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::matrixLU(in_RDI);
    MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::triangularView<2u>
              ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)func);
    TriangularView<Eigen::Matrix<double,-1,-1,0,-1,-1>const,2u>::
    solveInPlace<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2U> *)in_RDI,
               (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)func);
    return;
  }
  __assert_fail("rhs().rows() == dec().matrixLU().rows()",
                "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/LU/PartialPivLU.h"
                ,0x1cc,
                "void Eigen::internal::solve_retval<Eigen::PartialPivLU<Eigen::Matrix<double, -1, -1>>, Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>, Eigen::Matrix<double, -1, -1>>>::evalTo(Dest &) const [DecompositionType = Eigen::PartialPivLU<Eigen::Matrix<double, -1, -1>>, Rhs = Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>, Eigen::Matrix<double, -1, -1>>, Dest = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

void evalTo(Dest& dst) const
  {
    /* The decomposition PA = LU can be rewritten as A = P^{-1} L U.
    * So we proceed as follows:
    * Step 1: compute c = Pb.
    * Step 2: replace c by the solution x to Lx = c.
    * Step 3: replace c by the solution x to Ux = c.
    */

    eigen_assert(rhs().rows() == dec().matrixLU().rows());

    // Step 1
    dst = dec().permutationP() * rhs();

    // Step 2
    dec().matrixLU().template triangularView<UnitLower>().solveInPlace(dst);

    // Step 3
    dec().matrixLU().template triangularView<Upper>().solveInPlace(dst);
  }